

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.h
# Opt level: O2

bool __thiscall tupleCompare::operator()(tupleCompare *this,Tuple *A,Tuple *B)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = (ulong)((long)(A->data).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(A->data).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  uVar6 = (ulong)((long)(B->data).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(B->data).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  uVar7 = 0;
  iVar2 = (int)uVar3;
  uVar4 = 0;
  if (0 < iVar2) {
    uVar4 = uVar3 & 0xffffffff;
  }
  uVar3 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar3 = uVar7;
  }
  uVar6 = 0;
  do {
    uVar5 = uVar6;
    uVar6 = uVar5;
    if (uVar4 == uVar5) goto LAB_00113539;
    if (uVar3 == uVar5) break;
    bVar1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(((A->data).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           uVar7),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(((B->data).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + uVar7));
    if (bVar1) {
      uVar6 = 1;
      goto LAB_00113539;
    }
    bVar1 = std::operator>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(((A->data).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           uVar7),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(((B->data).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + uVar7));
    uVar7 = uVar7 + 0x20;
    uVar6 = uVar5 + 1;
  } while (!bVar1);
  uVar6 = 0;
LAB_00113539:
  return (bool)((long)uVar5 < (long)iVar2 & (byte)uVar6);
}

Assistant:

bool operator()(const Tuple& A, const Tuple& B)
 {
//   cout << "Called compare" << endl;
   int lA = A.data.size();
   int lB = B.data.size();
   for (int i = 0; i < lA; i++)
   {
    // cout << lB << "comparing " << A[i] << " to " << B[i] << endl;
     if (i >= lB) return false;
     if (A.data[i] < B.data[i]) return true;
     else if (A.data[i] > B.data[i]) return false;
   }
   return false;
 }